

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

PackageSymbol *
slang::ast::PackageSymbol::fromSyntax
          (Scope *scope,ModuleDeclarationSyntax *syntax,NetType *defaultNetType,
          optional<slang::TimeScale> directiveTimeScale)

{
  pointer ppMVar1;
  SyntaxKind SVar2;
  Compilation *args;
  ModuleHeaderSyntax *pMVar3;
  TimeUnitsDeclarationSyntax *syntax_00;
  SyntaxNode *pSVar4;
  _Optional_payload_base<slang::ast::VariableLifetime> _Var5;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  int iVar6;
  _Optional_payload_base<slang::ast::VariableLifetime> _Var7;
  PackageSymbol *this;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  pointer ppMVar8;
  bool isFirst;
  iterator __begin5;
  PackageImportItemSyntax *item;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> exportDecls;
  
  args = scope->compilation;
  pMVar3 = (syntax->header).ptr;
  token.kind = (pMVar3->lifetime).kind;
  token._2_1_ = (pMVar3->lifetime).field_0x2;
  token.numFlags.raw = (pMVar3->lifetime).numFlags.raw;
  token.rawLen = (pMVar3->lifetime).rawLen;
  token.info = (pMVar3->lifetime).info;
  _Var7 = (_Optional_payload_base<slang::ast::VariableLifetime>)
          SemanticFacts::getVariableLifetime(token);
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>._0_16_ =
       parsing::Token::valueText(&((syntax->header).ptr)->name);
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       parsing::Token::location(&((syntax->header).ptr)->name);
  _Var5._M_payload = (_Storage<slang::ast::VariableLifetime,_true>)0x1;
  _Var5._M_engaged = false;
  _Var5._5_3_ = 0;
  if (((ulong)_Var7 >> 0x20 & 1) != 0) {
    _Var5 = _Var7;
  }
  precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._0_4_ = _Var5._M_payload;
  this = BumpAllocator::
         emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                   (&args->super_BumpAllocator,args,
                    (basic_string_view<char,_std::char_traits<char>_> *)&exportDecls,
                    (SourceLocation *)&unitsRange,defaultNetType,(VariableLifetime *)&precisionRange
                   );
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_01._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_01._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.len = 0;
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.data_ =
       (pointer)exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.
                firstElement;
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>.cap = 5;
  ppMVar8 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  ppMVar1 = ppMVar8 + (syntax->members).
                      super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
                      _M_extent_value;
  isFirst = true;
  src = extraout_RDX;
  do {
    if (ppMVar8 == ppMVar1) {
      iVar6 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::copy
                        (&exportDecls.
                          super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>,
                         (EVP_PKEY_CTX *)args,src);
      (this->exportDecls)._M_ptr = (pointer)CONCAT44(extraout_var,iVar6);
      (this->exportDecls)._M_extent._M_extent_value = extraout_RDX_02;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._4_4_ =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._4_4_;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._0_4_ =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._0_4_;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      SemanticFacts::populateTimeScale
                (&this->timeScale,scope,directiveTimeScale,unitsRange_00,precisionRange_00);
      SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::cleanup
                (&exportDecls.super_SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>,
                 (EVP_PKEY_CTX *)scope);
      return this;
    }
    syntax_00 = (TimeUnitsDeclarationSyntax *)*ppMVar8;
    SVar2 = (syntax_00->super_MemberSyntax).super_SyntaxNode.kind;
    if (SVar2 == PackageExportAllDeclaration) {
      this->hasExportAll = true;
LAB_00360b6c:
      Scope::addMembers(&this->super_Scope,(SyntaxNode *)syntax_00);
      isFirst = false;
      src = extraout_RDX_01;
    }
    else {
      if (SVar2 == PackageExportDeclaration) {
        __begin5.index = 0;
        pSVar4 = syntax_00[1].super_MemberSyntax.super_SyntaxNode.parent;
        __begin5.list = (ParentList *)&syntax_00->time;
        for (; (__begin5.list != (ParentList *)&syntax_00->time ||
               (__begin5.index != (ulong)((long)&pSVar4->kind + 1) >> 1));
            __begin5.index = __begin5.index + 1) {
          item = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
                 iterator_base<slang::syntax::PackageImportItemSyntax_*>::dereference(&__begin5);
          SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*>::
          emplace_back<slang::syntax::PackageImportItemSyntax_const*const&>
                    ((SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*> *)&exportDecls,
                     &item);
        }
        goto LAB_00360b6c;
      }
      if (SVar2 != TimeUnitsDeclaration) goto LAB_00360b6c;
      if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
        (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_payload =
             (_Storage<slang::TimeScale,_true>)0x1030103;
        (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
      }
      SemanticFacts::populateTimeScale
                ((TimeScale *)&this->timeScale,scope,syntax_00,&unitsRange,&precisionRange,isFirst);
      src = extraout_RDX_00;
    }
    ppMVar8 = ppMVar8 + 1;
  } while( true );
}

Assistant:

PackageSymbol& PackageSymbol::fromSyntax(const Scope& scope, const ModuleDeclarationSyntax& syntax,
                                         const NetType& defaultNetType,
                                         std::optional<TimeScale> directiveTimeScale) {
    auto& comp = scope.getCompilation();
    auto lifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime);
    auto result = comp.emplace<PackageSymbol>(comp, syntax.header->name.valueText(),
                                              syntax.header->name.location(), defaultNetType,
                                              lifetime.value_or(VariableLifetime::Static));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;
    SmallVector<const PackageImportItemSyntax*> exportDecls;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!result->timeScale)
                result->timeScale.emplace();

            SemanticFacts::populateTimeScale(*result->timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;

        if (member->kind == SyntaxKind::PackageExportAllDeclaration) {
            result->hasExportAll = true;
        }
        else if (member->kind == SyntaxKind::PackageExportDeclaration) {
            for (auto item : member->as<PackageExportDeclarationSyntax>().items)
                exportDecls.push_back(item);
        }

        result->addMembers(*member);
    }

    result->exportDecls = exportDecls.copy(comp);

    SemanticFacts::populateTimeScale(result->timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
    return *result;
}